

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_dflt_value(lys_ypr_ctx *pctx,ly_ctx *ly_pctx,lyd_value *value,lysc_ext_instance *exts)

{
  char *text;
  char *str;
  lysc_ext_instance *plStack_28;
  ly_bool dynamic;
  lysc_ext_instance *exts_local;
  lyd_value *value_local;
  ly_ctx *ly_pctx_local;
  lys_ypr_ctx *pctx_local;
  
  plStack_28 = exts;
  exts_local = (lysc_ext_instance *)value;
  value_local = (lyd_value *)ly_pctx;
  ly_pctx_local = (ly_ctx *)pctx;
  text = (char *)(*value->realtype->plugin->print)
                           (ly_pctx,value,LY_VALUE_JSON,(void *)0x0,(ly_bool *)((long)&str + 7),
                            (size_t *)0x0);
  ypr_substmt((lys_ypr_ctx *)ly_pctx_local,LY_STMT_DEFAULT,'\0',text,'\0',plStack_28);
  if (str._7_1_ != '\0') {
    free(text);
  }
  return;
}

Assistant:

static void
yprc_dflt_value(struct lys_ypr_ctx *pctx, const struct ly_ctx *ly_pctx, const struct lyd_value *value,
        struct lysc_ext_instance *exts)
{
    ly_bool dynamic;
    const char *str;

    str = value->realtype->plugin->print(ly_pctx, value, LY_VALUE_JSON, NULL, &dynamic, NULL);
    ypr_substmt(pctx, LY_STMT_DEFAULT, 0, str, 0, exts);
    if (dynamic) {
        free((void *)str);
    }
}